

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,RATiedFlags flags,RegMask useRegMask,
          uint32_t useId,uint32_t useRewriteMask,RegMask outRegMask,uint32_t outId,
          uint32_t outRewriteMask,uint32_t rmSize,uint32_t consecutiveParent)

{
  BaseCompiler **ppBVar1;
  RABlock **ppRVar2;
  Array<unsigned_char,_4UL> *pAVar3;
  int iVar4;
  undefined4 *puVar5;
  Logger *this_00;
  FuncNode *pFVar6;
  RABlock *pRVar7;
  RABlock *this_01;
  BaseRAPass *pBVar8;
  InstControlFlow IVar9;
  uint uVar10;
  Error EVar11;
  Error EVar12;
  Error EVar13;
  RABlock *pRVar14;
  undefined8 extraout_RAX;
  byte bVar15;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar20;
  Error EVar21;
  uint uVar22;
  uint *puVar23;
  uint uVar24;
  InvokeNode *initialNode;
  char cVar25;
  uint uVar26;
  InvokeNode *pIVar27;
  bool bVar28;
  bool bVar29;
  char cVar30;
  float __x;
  InstControlFlow IStack_10fc;
  Error EStack_10f8;
  undefined4 uStack_10f4;
  uint64_t uStack_10f0;
  long lStack_10e8;
  long lStack_10e0;
  RABlock *pRStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined4 uStack_10b8;
  undefined8 uStack_10b4;
  undefined8 uStack_10ac;
  undefined8 uStack_10a4;
  undefined8 uStack_109c;
  undefined4 uStack_1094;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  uint *puStack_1080;
  uint auStack_1078 [3];
  byte abStack_106a [4082];
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined8 uStack_60;
  ulong uStack_58;
  code *pcStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  byte bVar16;
  
  uVar10 = *(uint *)(workReg + 0x20) >> 8 & 0xf;
  lVar20 = *(long *)(workReg + 0x10);
  bVar15 = (byte)(*(uint *)(workReg + 0x20) >> 8);
  bVar16 = (byte)useId;
  bVar18 = (byte)uVar10;
  if (useId != 0xff) {
    *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x100 << (bVar15 & 0xf);
    if (3 < bVar18) {
      pcStack_40 = (code *)0x13a4bd;
      add();
      goto LAB_0013a4bd;
    }
    *(uint *)(this + (ulong)uVar10 * 4 + 0x18) =
         *(uint *)(this + (ulong)uVar10 * 4 + 0x18) | 1 << (bVar16 & 0x1f);
    flags = flags | kUseFixed;
  }
  bVar17 = (byte)outId;
  if (outId != 0xff) {
    if (3 < bVar18) {
LAB_0013a4bd:
      pcStack_40 = (code *)0x13a4c2;
      add();
      return 0x41;
    }
    *(uint *)(this + (ulong)uVar10 * 4 + 0x28) =
         *(uint *)(this + (ulong)uVar10 * 4 + 0x28) | 1 << (bVar17 & 0x1f);
    flags = flags | kOutFixed;
  }
  *(RATiedFlags *)(this + 8) = *(RATiedFlags *)(this + 8) | flags;
  uVar26 = 1 << (bVar15 & 0xf);
  *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | uVar26;
  if (lVar20 != 0) {
    if (*(uint32_t *)(lVar20 + 4) != consecutiveParent) {
      if (*(uint32_t *)(lVar20 + 4) != 0xffffffff) {
        return 3;
      }
      *(uint32_t *)(lVar20 + 4) = consecutiveParent;
    }
    if (useId != 0xff) {
      if (*(char *)(lVar20 + 0xe) != -1) {
        return 0x41;
      }
      *(byte *)(lVar20 + 0xe) = bVar16;
    }
    if (outId != 0xff) {
      if (*(char *)(lVar20 + 0xf) != -1) {
        return 0x41;
      }
      *(byte *)(lVar20 + 0xf) = bVar17;
    }
    *(char *)(lVar20 + 0xc) = *(char *)(lVar20 + 0xc) + '\x01';
    *(RATiedFlags *)(lVar20 + 8) = *(RATiedFlags *)(lVar20 + 8) | flags;
    *(uint *)(lVar20 + 0x10) = *(uint *)(lVar20 + 0x10) & useRegMask;
    *(uint *)(lVar20 + 0x18) = *(uint *)(lVar20 + 0x18) | useRewriteMask;
    *(uint *)(lVar20 + 0x14) = *(uint *)(lVar20 + 0x14) & outRegMask;
    *(uint *)(lVar20 + 0x1c) = *(uint *)(lVar20 + 0x1c) | outRewriteMask;
    bVar18 = (byte)rmSize;
    if (rmSize < *(byte *)(lVar20 + 0xd)) {
      bVar18 = *(byte *)(lVar20 + 0xd);
    }
    *(byte *)(lVar20 + 0xd) = bVar18;
    return 0;
  }
  puVar5 = *(undefined4 **)(this + 0x38);
  if (((long)puVar5 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
    *(undefined4 **)(this + 0x38) = puVar5 + 8;
    *puVar5 = *(undefined4 *)workReg;
    puVar5[1] = consecutiveParent;
    puVar5[2] = flags;
    *(undefined1 *)(puVar5 + 3) = 1;
    *(byte *)((long)puVar5 + 0xd) = (byte)rmSize;
    *(byte *)((long)puVar5 + 0xe) = bVar16;
    *(byte *)((long)puVar5 + 0xf) = bVar17;
    puVar5[4] = useRegMask;
    puVar5[5] = outRegMask;
    puVar5[6] = useRewriteMask;
    puVar5[7] = outRewriteMask;
    *(undefined4 **)(workReg + 0x10) = puVar5;
    *(undefined4 *)(workReg + 0x28) = *(undefined4 *)this;
    if (3 < bVar18) goto LAB_0013a4ce;
    if (this[(ulong)uVar10 + 0x10] != (RAInstBuilder)0xff) {
      *(int *)(this + 0x10) = *(int *)(this + 0x10) + (1 << (bVar18 * '\b' & 0x1f));
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x13a4ce;
    add();
LAB_0013a4ce:
    pcStack_40 = (code *)0x13a4d3;
    add();
  }
  pcStack_40 = addCallArg;
  add();
  if (extraout_EDX == 0xff) {
    uStack_48 = 0x13a5d6;
    addCallArg();
LAB_0013a5d6:
    uStack_48 = 0x13a5db;
    addCallArg();
LAB_0013a5db:
    uStack_48 = 0x13a5e0;
    addCallArg();
  }
  else {
    uVar10 = *(uint *)(workReg + 0x20);
    uVar22 = uVar10 >> 8 & 0xf;
    bVar18 = (byte)extraout_EDX;
    uVar24 = 1 << (bVar18 & 0x1f);
    ppBVar1 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc;
    *(uint *)ppBVar1 = *(uint *)ppBVar1 | 0x45;
    if (3 < (byte)uVar22) goto LAB_0013a5d6;
    pAVar3 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _formatOptions._indentation + ((ulong)uVar22 - 0x11);
    *(uint *)pAVar3->_data = *(uint *)pAVar3->_data | uVar24;
    puVar23 = (uint *)((long)&(((RACFGBuilder *)this)->
                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 4);
    *puVar23 = *puVar23 | 0x101 << ((byte)(uVar10 >> 8) & 0xf);
    lVar20 = *(long *)(workReg + 0x10);
    if (lVar20 != 0) {
      if (*(char *)(lVar20 + 0xe) == -1) {
        *(byte *)(lVar20 + 0xe) = bVar18;
        *(uint *)(lVar20 + 0x10) = *(uint *)(lVar20 + 0x10) & uVar24;
        uVar10 = 0x45;
      }
      else {
        *(uint *)(lVar20 + 0x10) = *(uint *)(lVar20 + 0x10) | uVar24;
        uVar10 = 0x10045;
      }
      *(char *)(lVar20 + 0xc) = *(char *)(lVar20 + 0xc) + '\x01';
      *(uint *)(lVar20 + 8) = *(uint *)(lVar20 + 8) | uVar10;
      return 0;
    }
    puVar5 = *(undefined4 **)
              &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
               field_0x38;
    if (((long)puVar5 + (-0x40 - (long)this) & 0x1ffffff000U) != 0) goto LAB_0013a5db;
    *(undefined4 **)
     &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).field_0x38 =
         puVar5 + 8;
    *puVar5 = *(undefined4 *)workReg;
    *(undefined8 *)(puVar5 + 1) = 0x45ffffffff;
    *(undefined2 *)(puVar5 + 3) = 1;
    *(byte *)((long)puVar5 + 0xe) = bVar18;
    *(undefined1 *)((long)puVar5 + 0xf) = 0xff;
    puVar5[4] = uVar24;
    puVar5[5] = uVar24;
    *(undefined8 *)(puVar5 + 6) = 0;
    *(undefined4 **)(workReg + 0x10) = puVar5;
    *(undefined4 *)(workReg + 0x28) =
         *(undefined4 *)
          &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
    if (*(char *)((long)(&(((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._formatOptions + -6
                        ) + (ulong)uVar22) != -1) {
      ppRVar2 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock;
      *(int *)ppRVar2 = *(int *)ppRVar2 + (1 << ((byte)uVar22 * '\b' & 0x1f));
      return 0;
    }
  }
  uStack_48 = 0x13a5e5;
  addCallArg();
  if (extraout_EDX_00 == 0xff) {
    pcStack_50 = (code *)0x13a6d9;
    addCallRet();
LAB_0013a6d9:
    pcStack_50 = (code *)0x13a6de;
    addCallRet();
  }
  else {
    uVar10 = *(uint *)(workReg + 0x20);
    uVar22 = uVar10 >> 8 & 0xf;
    bVar18 = (byte)extraout_EDX_00;
    uVar24 = 1 << (bVar18 & 0x1f);
    ppBVar1 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._cc;
    *(uint *)ppBVar1 = *(uint *)ppBVar1 | 0x8a;
    if (3 < (byte)uVar22) goto LAB_0013a6d9;
    pAVar3 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _formatOptions._indentation + ((ulong)uVar22 - 0x11);
    *(uint *)pAVar3->_data = *(uint *)pAVar3->_data | uVar24;
    puVar23 = (uint *)((long)&(((RACFGBuilder *)this)->
                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 4);
    *puVar23 = *puVar23 | 0x101 << ((byte)(uVar10 >> 8) & 0xf);
    lVar20 = *(long *)(workReg + 0x10);
    if (lVar20 != 0) {
      if (*(char *)(lVar20 + 0xf) == -1) {
        *(char *)(lVar20 + 0xc) = *(char *)(lVar20 + 0xc) + '\x01';
        *(byte *)(lVar20 + 8) = *(byte *)(lVar20 + 8) | 0x8a;
        *(byte *)(lVar20 + 0xf) = bVar18;
        return 0;
      }
      return 0x41;
    }
    puVar5 = *(undefined4 **)
              &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
               field_0x38;
    if (((long)puVar5 + (-0x40 - (long)this) & 0x1ffffff000U) == 0) {
      *(undefined4 **)
       &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).field_0x38 =
           puVar5 + 8;
      *puVar5 = *(undefined4 *)workReg;
      *(undefined8 *)(puVar5 + 1) = 0x8affffffff;
      *(undefined2 *)(puVar5 + 3) = 1;
      *(undefined1 *)((long)puVar5 + 0xe) = 0xff;
      *(byte *)((long)puVar5 + 0xf) = bVar18;
      puVar5[4] = 0xffffffff;
      puVar5[5] = uVar24;
      *(undefined8 *)(puVar5 + 6) = 0;
      *(undefined4 **)(workReg + 0x10) = puVar5;
      *(undefined4 *)(workReg + 0x28) =
           *(undefined4 *)
            &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
      if (*(char *)((long)(&(((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._formatOptions +
                          -6) + (ulong)uVar22) != -1) {
        ppRVar2 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _curBlock;
        *(int *)ppRVar2 = *(int *)ppRVar2 + (1 << ((byte)uVar22 * '\b' & 0x1f));
        return 0;
      }
      goto LAB_0013a6e3;
    }
  }
  pcStack_50 = (code *)0x13a6e3;
  addCallRet();
LAB_0013a6e3:
  pcStack_50 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run;
  addCallRet();
  uStack_60 = 0x1ffffff000;
  this_00 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger;
  uStack_78 = (ulong)useRegMask;
  uStack_70 = (ulong)outRegMask;
  uStack_68 = (ulong)consecutiveParent;
  uStack_58 = (ulong)uVar26;
  pcStack_50 = (code *)(ulong)rmSize;
  if (this_00 != (Logger *)0x0) {
    Logger::logf(this_00,__x);
  }
  EVar11 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
                     ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this);
  if (EVar11 == 0) {
    if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
        (Logger *)0x0) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (BaseNode *)
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _funcNode,2,(char *)0x0);
    }
    if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
        (Logger *)0x0) {
      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock,2);
    }
    pFVar6 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
             _funcNode;
    pIVar27 = *(InvokeNode **)&pFVar6->field_0x8;
    if (pIVar27 == (InvokeNode *)0x0) {
LAB_0013b136:
      EVar11 = 3;
    }
    else {
      ppRVar2 = &(((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _curBlock;
      pRStack_10d8 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._curBlock;
      *(FuncNode **)(pRStack_10d8 + 0x10) = pFVar6;
      *(FuncNode **)(pRStack_10d8 + 0x18) = pFVar6;
      uStack_10b8 = 0xffffffff;
      uStack_10b4 = 0;
      uStack_10ac = 0;
      uStack_10a4 = 0;
      uStack_109c = 0;
      uStack_1094 = 0;
      uStack_1090 = 0;
      uStack_1088 = 0;
      puStack_1080 = auStack_1078;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      EVar12 = EVar11;
      do {
        iVar4 = *(int *)&pIVar27->field_0x14;
        if (1 < iVar4 + 1U) {
LAB_0013b10f:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&pIVar27->field_0x8;
        EVar13 = EVar11;
        if ((pIVar27->field_0x11 & 0x20) != 0) {
          if (*ppRVar2 == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar27);
            cVar30 = '\x05';
            pIVar27 = initialNode;
            goto LAB_0013aba9;
          }
          (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._hasCode =
               true;
          if ((byte)(pIVar27->field_0x10 - 0x11) < 2) {
            if (iVar4 == -1) {
              *(undefined4 *)&pIVar27->field_0x14 = 0;
            }
            else {
              lVar20 = *(long *)pIVar27;
              if ((pIVar27->field_0x10 == '\x12') &&
                 (EVar13 = a64::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,pIVar27),
                 EVar12 = EVar11, EVar13 != 0)) {
                bVar29 = false;
                EVar11 = EVar13;
                EVar12 = EVar13;
              }
              else {
                if (lVar20 != *(long *)pIVar27) {
                  if (*(InvokeNode **)(*ppRVar2 + 0x10) == pIVar27) {
                    *(undefined8 *)(*ppRVar2 + 0x10) = *(undefined8 *)(lVar20 + 8);
                  }
                  *(undefined4 *)&pIVar27->field_0x14 = 0xffffffff;
                  pIVar27 = *(InvokeNode **)(lVar20 + 8);
                  if ((pIVar27->field_0x11 & 0x20) == 0) {
LAB_0013b12c:
                    RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                    goto LAB_0013b131;
                  }
                }
                initialNode = *(InvokeNode **)&pIVar27->field_0x8;
                bVar29 = true;
              }
              cVar30 = '\x01';
              EVar13 = EVar11;
              if (!bVar29) goto LAB_0013aba9;
            }
          }
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar27,4
                       ,(char *)0x0);
          }
          IStack_10fc = kRegular;
          uStack_10b8 = *(undefined4 *)
                         ((((RACFGBuilder *)this)->
                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock + 8);
          uStack_1094 = 0;
          uStack_10a4 = 0;
          uStack_109c = 0;
          uStack_10b4 = 0;
          uStack_10ac = 0;
          uStack_1090 = 0;
          uStack_1088 = 0;
          puStack_1080 = auStack_1078;
          EVar11 = a64::RACFGBuilder::onInst
                             ((RACFGBuilder *)this,(InstNode *)pIVar27,&IStack_10fc,
                              (RAInstBuilder *)&uStack_10b8);
          cVar25 = '\x01';
          cVar30 = cVar25;
          if ((EVar11 == 0) &&
             ((pIVar27->field_0x10 != '\x12' ||
              (EVar11 = a64::RACFGBuilder::onInvoke
                                  ((RACFGBuilder *)this,pIVar27,(RAInstBuilder *)&uStack_10b8),
              EVar11 == 0)))) {
            if (pIVar27->field_0x10 == '\x11') {
              EVar11 = a64::RACFGBuilder::onRet
                                 ((RACFGBuilder *)this,(FuncRetNode *)pIVar27,
                                  (RAInstBuilder *)&uStack_10b8);
              if (EVar11 != 0) goto LAB_0013aa3c;
              IStack_10fc = kMaxValue;
            }
            if ((IStack_10fc == kJump) && (auStack_1078 != puStack_1080)) {
              pBVar8 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
              pRVar14 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              uVar10 = 0;
              puVar23 = auStack_1078;
              do {
                if (*(uint *)&pBVar8->field_0x148 <= *puVar23) {
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  goto LAB_0013b10f;
                }
                if ((*(byte *)(*(long *)(*(long *)&pBVar8->_workRegs + (ulong)*puVar23 * 8) + 0x21)
                    & 0xf) == 0) {
                  bVar18 = *(byte *)((long)puVar23 + 0xe);
                  if (bVar18 == 0xff) {
                    if (1 < uVar10) {
                      RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                      goto LAB_0013b12c;
                    }
                    uVar19 = (ulong)uVar10;
                    uVar10 = uVar10 + 1;
                    bVar18 = (pBVar8->_scratchRegIndexes)._data[uVar19];
                    *(byte *)((long)puVar23 + 0xe) = bVar18;
                  }
                  pRVar7 = pRVar14 + 0xc0;
                  *(uint *)pRVar7 = *(uint *)pRVar7 | 1 << (bVar18 & 0x1f);
                }
                puVar23 = puVar23 + 8;
              } while (puVar23 != puStack_1080);
            }
            EVar11 = BaseRAPass::assignRAInst
                               ((((RACFGBuilder *)this)->
                                super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                (BaseNode *)pIVar27,
                                (((RACFGBuilder *)this)->
                                super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock,
                                (RAInstBuilder *)&uStack_10b8);
            IVar9 = IStack_10fc;
            if (EVar11 == 0) {
              uVar10 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._blockRegStats._packed
                       | (uint)uStack_10a4;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = uVar10;
              if (IStack_10fc != kRegular) {
                if (IStack_10fc < kCall) {
                  pRVar14 = *ppRVar2;
                  *(InvokeNode **)(pRVar14 + 0x18) = pIVar27;
                  uVar26 = *(uint *)(pRVar14 + 0xc);
                  *(uint *)(pRVar14 + 0xc) = uVar26 | 0x101;
                  *(uint *)(pRVar14 + 0x30) = *(uint *)(pRVar14 + 0x30) | uVar10;
                  if ((pIVar27->field_0x34 & 2) == 0) {
                    if (pIVar27->field_0x12 == 0) {
                      cVar30 = '\x01';
                      EVar12 = 3;
                    }
                    else {
                      lVar20 = (ulong)((byte)pIVar27->field_0x12 - 1) * 0x10;
                      if ((*(uint *)(&pIVar27->field_0x40 + lVar20) & 7) == 5) {
                        EVar11 = BaseBuilder::labelNodeOf
                                           (&((((RACFGBuilder *)this)->
                                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                                             ._cc)->super_BaseBuilder,(LabelNode **)&EStack_10f8,
                                            *(uint32_t *)(&pIVar27->field_0x44 + lVar20));
                        if (EVar11 == 0) {
                          bVar29 = false;
                          pRVar14 = BaseRAPass::newBlockOrExistingAt
                                              ((((RACFGBuilder *)this)->
                                               super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                               )._pass,(LabelNode *)
                                                       CONCAT44(uStack_10f4,EStack_10f8),
                                               (BaseNode **)0x0);
                          if (pRVar14 == (RABlock *)0x0) {
                            EVar11 = 1;
                          }
                          else {
                            pRVar14[0xc] = (RABlock)((byte)pRVar14[0xc] | 4);
                            EVar13 = RABlock::appendSuccessor(*ppRVar2,pRVar14);
                            bVar29 = EVar13 == 0;
                            EVar11 = EVar12;
                            if (!bVar29) {
                              EVar11 = EVar13;
                            }
                          }
                        }
                        else {
                          bVar29 = false;
                        }
                        cVar30 = '\x01';
                        EVar12 = EVar11;
                        if (bVar29) {
LAB_0013af05:
                          cVar30 = '\0';
                          EVar12 = EVar11;
                        }
                      }
                      else {
                        *(uint *)(pRVar14 + 0xc) = uVar26 | 0x501;
                        if (pIVar27->field_0x10 == '\x0f') {
                          lVar20 = *(long *)&pIVar27->_funcDetail;
                        }
                        else {
                          lVar20 = 0;
                        }
                        pBVar8 = (((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
                        if (lVar20 == 0) {
                          EVar11 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                             ((ZoneVector<asmjit::v1_14::RABlock_*> *)&uStack_10d0,
                                              &pBVar8->_allocator,ppRVar2);
                          cVar30 = '\x01';
                          if (EVar11 == 0) goto LAB_0013aeff;
                        }
                        else {
                          uStack_10f0 = pBVar8->_lastTimestamp + 1;
                          pBVar8->_lastTimestamp = uStack_10f0;
                          bVar29 = (ulong)*(uint *)(lVar20 + 0x18) == 0;
                          if (!bVar29) {
                            lStack_10e0 = *(long *)(lVar20 + 0x10);
                            lStack_10e8 = (ulong)*(uint *)(lVar20 + 0x18) << 2;
                            lVar20 = 0;
                            do {
                              EVar11 = BaseBuilder::labelNodeOf
                                                 (&((((RACFGBuilder *)this)->
                                                                                                        
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._cc)->super_BaseBuilder,
                                                  (LabelNode **)&EStack_10f8,
                                                  *(uint32_t *)(lStack_10e0 + lVar20));
                              if (EVar11 == 0) {
                                pRVar14 = BaseRAPass::newBlockOrExistingAt
                                                    ((((RACFGBuilder *)this)->
                                                                                                          
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._pass,(LabelNode *)
                                                          CONCAT44(uStack_10f4,EStack_10f8),
                                                  (BaseNode **)0x0);
                                if (pRVar14 == (RABlock *)0x0) {
                                  EVar11 = 1;
                                  goto LAB_0013ade1;
                                }
                                bVar28 = true;
                                if (*(uint64_t *)(pRVar14 + 0x48) != uStack_10f0) {
                                  *(uint64_t *)(pRVar14 + 0x48) = uStack_10f0;
                                  pRVar14[0xc] = (RABlock)((byte)pRVar14[0xc] | 4);
                                  EVar11 = RABlock::appendSuccessor(*ppRVar2,pRVar14);
                                  bVar28 = EVar11 == 0;
                                  if (!bVar28) {
                                    EVar12 = EVar11;
                                  }
                                }
                              }
                              else {
LAB_0013ade1:
                                bVar28 = false;
                                EVar12 = EVar11;
                              }
                              if (!bVar28) {
                                cVar30 = '\x01';
                                goto LAB_0013aeda;
                              }
                              lVar20 = lVar20 + 4;
                              bVar29 = lStack_10e8 == lVar20;
                            } while (!bVar29);
                          }
                          cVar30 = '\x1c';
LAB_0013aeda:
                          EVar11 = EVar12;
                          if (bVar29) {
                            EVar12 = RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::
                                     shareAssignmentAcrossSuccessors
                                               ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)
                                                this,(((RACFGBuilder *)this)->
                                                                                                          
                                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                                                  )._curBlock);
                            cVar30 = EVar12 != 0;
                            if ((bool)cVar30) {
                              EVar11 = EVar12;
                            }
                          }
                          EVar12 = EVar11;
                          if (cVar30 == '\0') {
LAB_0013aeff:
                            EVar11 = EVar12;
                            cVar30 = '\0';
                          }
                        }
                        EVar12 = EVar11;
                        if (cVar30 == '\0') goto LAB_0013af05;
                      }
                    }
                    EVar11 = EVar12;
                    if (cVar30 != '\0') goto LAB_0013aa3c;
                  }
                  if (IVar9 != kJump) {
                    pIVar27 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar11 = 3;
                      cVar30 = cVar25;
                      goto LAB_0013aa3c;
                    }
                    if (initialNode->field_0x10 == '\x03') {
                      pRVar14 = *(RABlock **)&initialNode->field_0x20;
                      if (pRVar14 == (RABlock *)0x0) {
                        pRVar14 = BaseRAPass::newBlock
                                            ((((RACFGBuilder *)this)->
                                             super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                             _pass,(BaseNode *)initialNode);
                        if (pRVar14 == (RABlock *)0x0) goto LAB_0013b0a3;
                        *(RABlock **)&initialNode->field_0x20 = pRVar14;
                      }
                    }
                    else {
                      pRVar14 = BaseRAPass::newBlock
                                          ((((RACFGBuilder *)this)->
                                           super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                           _pass,(BaseNode *)initialNode);
                      if (pRVar14 == (RABlock *)0x0) {
LAB_0013b0a3:
                        EVar11 = 1;
                        cVar30 = '\x01';
                        goto LAB_0013aa3c;
                      }
                    }
                    this_01 = *ppRVar2;
                    pRVar7 = this_01 + 0xc;
                    *(uint *)pRVar7 = *(uint *)pRVar7 | 0x200;
                    EVar11 = RABlock::prependSuccessor(this_01,pRVar14);
                    cVar30 = cVar25;
                    if (EVar11 == 0) {
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._curBlock = pRVar14;
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._hasCode = false;
                      (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._blockRegStats._packed = 0;
                      if (((byte)pRVar14[0xc] & 1) == 0) {
                        EVar11 = BaseRAPass::addBlock
                                           ((((RACFGBuilder *)this)->
                                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                            _pass,pRVar14);
                        if ((EVar11 == 0) &&
                           (EVar11 = EVar12, cVar30 = '\x05',
                           (((RACFGBuilder *)this)->
                           super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._logger !=
                           (Logger *)0x0)) {
                          RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                                    ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,
                                     (((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                     _curBlock,2);
                        }
                      }
                      else {
                        EVar11 = EVar12;
                        cVar30 = '\x04';
                      }
                    }
                    goto LAB_0013aa3c;
                  }
                  *ppRVar2 = (RABlock *)0x0;
                }
                if (IVar9 == kMaxValue) {
                  pRVar14 = (((RACFGBuilder *)this)->
                            super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
                  *(InvokeNode **)(pRVar14 + 0x18) = pIVar27;
                  pRVar14[0xc] = (RABlock)((byte)pRVar14[0xc] | 1);
                  *(uint *)(pRVar14 + 0x30) =
                       *(uint *)(pRVar14 + 0x30) |
                       (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._blockRegStats._packed
                  ;
                  EVar11 = RABlock::appendSuccessor
                                     (pRVar14,(((RACFGBuilder *)this)->
                                              super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                                              ._retBlock);
                  cVar30 = cVar25;
                  if (EVar11 != 0) goto LAB_0013aa3c;
                  *ppRVar2 = (RABlock *)0x0;
                }
              }
              EVar11 = EVar12;
              cVar30 = '\0';
            }
          }
LAB_0013aa3c:
          EVar13 = EVar11;
          EVar12 = EVar11;
          if (cVar30 != '\0') goto LAB_0013aba9;
          goto LAB_0013ab9a;
        }
        if (pIVar27->field_0x10 == '\x03') {
          pRVar14 = *ppRVar2;
          pRVar7 = *(RABlock **)&pIVar27->field_0x20;
          if (pRVar14 != (RABlock *)0x0) {
            if (pRVar7 == (RABlock *)0x0) {
              if ((pRVar14 == pRStack_10d8 |
                  (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                  _hasCode) == 1) {
                if (*(InvokeNode **)(pRVar14 + 0x18) == pIVar27) {
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar14 + 0x18) = *(undefined8 *)pIVar27;
                *(uint *)(pRVar14 + 0xc) = *(uint *)(pRVar14 + 0xc) | 0x201;
                *(uint *)(pRVar14 + 0x30) =
                     *(uint *)(pRVar14 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                pRVar14 = BaseRAPass::newBlock
                                    ((((RACFGBuilder *)this)->
                                     super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                     (BaseNode *)pIVar27);
                cVar30 = '\x01';
                if (pRVar14 == (RABlock *)0x0) {
                  bVar29 = false;
                  EVar11 = 1;
                }
                else {
                  pRVar14[0xc] = (RABlock)((byte)pRVar14[0xc] | 4);
                  EVar12 = RABlock::appendSuccessor(*ppRVar2,pRVar14);
                  if ((EVar12 == 0) &&
                     (EVar12 = BaseRAPass::addBlock
                                         ((((RACFGBuilder *)this)->
                                          super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                                          _pass,pRVar14), EVar12 == 0)) {
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _curBlock = pRVar14;
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode = false;
                    (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _blockRegStats._packed = 0;
                    bVar29 = true;
                  }
                  else {
                    bVar29 = false;
                    EVar11 = EVar12;
                  }
                }
                EVar13 = EVar11;
                EVar12 = EVar11;
                if (!bVar29) goto LAB_0013aba9;
              }
              *(RABlock **)&pIVar27->field_0x20 = *ppRVar2;
              EVar21 = EVar12;
            }
            else {
              pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
              if (pRVar14 == pRVar7) {
                bVar29 = true;
                if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                    _hasCode == true) {
                  EVar12 = 3;
LAB_0013a84f:
                  EVar11 = EVar12;
                  bVar29 = false;
                  EVar12 = EVar11;
                }
              }
              else {
                if (*(InvokeNode **)(pRVar14 + 0x18) == pIVar27) {
LAB_0013b131:
                  RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
                  goto LAB_0013b136;
                }
                *(undefined8 *)(pRVar14 + 0x18) = *(undefined8 *)pIVar27;
                *(uint *)(pRVar14 + 0xc) = *(uint *)(pRVar14 + 0xc) | 0x201;
                *(uint *)(pRVar14 + 0x30) =
                     *(uint *)(pRVar14 + 0x30) |
                     (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)
                     ._blockRegStats._packed;
                EVar12 = RABlock::appendSuccessor(pRVar14,pRVar7);
                if ((EVar12 != 0) ||
                   (EVar12 = BaseRAPass::addBlock
                                       ((((RACFGBuilder *)this)->
                                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass
                                        ,pRVar7), EVar12 != 0)) goto LAB_0013a84f;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _curBlock = pRVar7;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _hasCode = false;
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _blockRegStats._packed = 0;
                bVar29 = true;
                EVar12 = EVar11;
              }
              cVar30 = '\x01';
              EVar13 = EVar11;
              EVar21 = EVar12;
              if (!bVar29) goto LAB_0013aba9;
            }
LAB_0013ab51:
            pRVar14 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>
                      )._curBlock;
            if (((pRVar14 != (RABlock *)0x0) &&
                (pRVar14 !=
                 (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                 _lastLoggedBlock)) &&
               ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0)) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,pRVar14,2);
            }
            if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _logger != (Logger *)0x0) {
              RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar27
                         ,2,(char *)0x0);
            }
            EVar12 = EVar21;
            if (*(uint32_t *)&pIVar27->field_0x30 ==
                (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _exitLabelId) {
              pRVar14 = (((RACFGBuilder *)this)->
                        super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              *(InvokeNode **)(pRVar14 + 0x18) = pIVar27;
              pRVar14[0xc] = (RABlock)((byte)pRVar14[0xc] | 1);
              *(uint *)(pRVar14 + 0x30) =
                   *(uint *)(pRVar14 + 0x30) |
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _blockRegStats._packed;
              EVar12 = BaseRAPass::addExitBlock
                                 ((((RACFGBuilder *)this)->
                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                  pRVar14);
              cVar30 = '\x01';
              EVar13 = EVar12;
              if (EVar12 != 0) goto LAB_0013aba9;
              *ppRVar2 = (RABlock *)0x0;
              EVar12 = EVar11;
            }
            goto LAB_0013ab9a;
          }
          *ppRVar2 = pRVar7;
          if (pRVar7 == (RABlock *)0x0) {
            pRVar14 = BaseRAPass::newBlock
                                ((((RACFGBuilder *)this)->
                                 super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                 (BaseNode *)pIVar27);
            (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
            _curBlock = pRVar14;
            if (pRVar14 != (RABlock *)0x0) {
              *(RABlock **)&pIVar27->field_0x20 = pRVar14;
              goto LAB_0013ab1a;
            }
            cVar30 = '\x01';
            EVar13 = 1;
            EVar12 = 1;
          }
          else {
            cVar30 = '\x04';
            if (((byte)pRVar7[0xc] & 1) == 0) {
LAB_0013ab1a:
              pRVar7 = (((RACFGBuilder *)this)->
                       super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._curBlock;
              pRVar14 = pRVar7 + 0xc;
              *(uint *)pRVar14 = *(uint *)pRVar14 | 4;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _hasCode = false;
              (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _blockRegStats._packed = 0;
              EVar12 = BaseRAPass::addBlock
                                 ((((RACFGBuilder *)this)->
                                  super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass,
                                  pRVar7);
              cVar30 = '\x01';
              EVar13 = EVar12;
              EVar21 = EVar11;
              if (EVar12 == 0) goto LAB_0013ab51;
            }
          }
        }
        else {
          if ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
              _logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *)this,(BaseNode *)pIVar27,4
                       ,(char *)0x0);
          }
          if (pIVar27->field_0x10 == '\n') {
            if (pIVar27 ==
                (InvokeNode *)
                ((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                _funcNode)->_end) {
              cVar30 = '\x04';
              if (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _curBlock == (RABlock *)0x0) ||
                 (((((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _hasCode & 1U) == 0)) goto LAB_0013aba9;
LAB_0013a904:
              cVar30 = '\x01';
              EVar13 = 3;
              EVar12 = 3;
              goto LAB_0013aba9;
            }
          }
          else if ((pIVar27->field_0x10 == '\x10') &&
                  (pIVar27 !=
                   (InvokeNode *)
                   (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _funcNode)) goto LAB_0013a904;
LAB_0013ab9a:
          cVar30 = '\0';
          pIVar27 = initialNode;
          EVar13 = EVar11;
          if (initialNode == (InvokeNode *)0x0) {
            EVar12 = 3;
            cVar30 = '\x01';
            EVar13 = 3;
          }
        }
LAB_0013aba9:
        EVar11 = EVar13;
      } while ((cVar30 == '\0') || (cVar30 == '\x05'));
      if ((cVar30 == '\x04') &&
         (pBVar8 = (((RACFGBuilder *)this)->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>).
                   _pass, EVar11 = 3, pBVar8->_createdBlockCount == *(uint32_t *)&pBVar8->field_0xb8
         )) {
        RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::run();
        EVar11 = EStack_10f8;
      }
    }
  }
  return EVar11;
}

Assistant:

Error add(
    RAWorkReg* workReg,
    RATiedFlags flags,
    RegMask useRegMask, uint32_t useId, uint32_t useRewriteMask,
    RegMask outRegMask, uint32_t outId, uint32_t outRewriteMask,
    uint32_t rmSize = 0,
    uint32_t consecutiveParent = Globals::kInvalidId
  ) noexcept {
    RegGroup group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedFlags::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedFlags::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Would happen when the builder is not reset properly after each instruction - so catch that!
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, useRegMask, useId, useRewriteMask, outRegMask, outId, outRewriteMask, rmSize, consecutiveParent);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (consecutiveParent != tiedReg->consecutiveParent()) {
        if (tiedReg->consecutiveParent() != Globals::kInvalidId)
          return DebugUtils::errored(kErrorInvalidState);
        tiedReg->_consecutiveParent = consecutiveParent;
      }

      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_useRegMask &= useRegMask;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRegMask &= outRegMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }